

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O1

void __thiscall DSDcc::DSDDstar::~DSDDstar(DSDDstar *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_header).m_mySign._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_header).m_mySign.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_header).m_yourSign._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_header).m_yourSign.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_header).m_rpt2._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_header).m_rpt2.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_header).m_rpt1._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_header).m_rpt1.field_2) {
    operator_delete(pcVar1);
  }
  CRC::~CRC(&this->m_crc);
  DStarCRC::~DStarCRC(&this->m_crcDStar);
  Viterbi3::~Viterbi3(&this->m_viterbi);
  return;
}

Assistant:

DSDDstar::~DSDDstar()
{
}